

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::VarintCasesWithSizes_WriteVarint64_Test::TestBody
          (VarintCasesWithSizes_WriteVarint64_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  __tuple_element_t<0UL,_tuple<VarintCase,_int>_> *__s2;
  __tuple_element_t<1UL,_tuple<VarintCase,_int>_> *p_Var3;
  char *pcVar4;
  char *in_R9;
  AssertHelper local_160;
  Message local_158;
  int local_150 [2];
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130;
  int64_t local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_1;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_90 [8];
  CodedOutputStream coded_output;
  ArrayOutputStream output;
  int *kBlockSizes_case;
  VarintCase *kVarintCases_case;
  VarintCasesWithSizes_WriteVarint64_Test *this_local;
  
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  __s2 = std::get<0ul,google::protobuf::io::(anonymous_namespace)::VarintCase,int>(pPVar2);
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>_>
           ::GetParam();
  p_Var3 = std::get<1ul,google::protobuf::io::(anonymous_namespace)::VarintCase,int>(pPVar2);
  ArrayOutputStream::ArrayOutputStream
            ((ArrayOutputStream *)&coded_output.start_count_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,0x10000,*p_Var3);
  CodedOutputStream::CodedOutputStream<google::protobuf::io::ArrayOutputStream,void>
            ((CodedOutputStream *)local_90,(ArrayOutputStream *)&coded_output.start_count_);
  CodedOutputStream::WriteVarint64((CodedOutputStream *)local_90,__s2->value);
  bVar1 = CodedOutputStream::HadError((CodedOutputStream *)local_90);
  local_b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_b0,
               (AssertionResult *)"coded_output.HadError()","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x125,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_fc = CodedOutputStream::ByteCount((CodedOutputStream *)local_90);
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_f8,"kVarintCases_case.size","coded_output.ByteCount()",&__s2->size,
             &local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x127,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_90);
  local_128 = ArrayOutputStream::ByteCount((ArrayOutputStream *)&coded_output.start_count_);
  testing::internal::EqHelper::Compare<unsigned_long,_long,_nullptr>
            ((EqHelper *)local_120,"kVarintCases_case.size","output.ByteCount()",&__s2->size,
             &local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x12a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_150[1] = 0;
  local_150[0] = memcmp(&io::(anonymous_namespace)::CodedStreamTest::buffer_,__s2,__s2->size);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_148,"0",
             "memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size)",local_150 + 1,
             local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,300,pcVar4);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&coded_output.start_count_);
  return;
}

Assistant:

TEST_P(VarintCasesWithSizes, WriteVarint64) {
  const VarintCase& kVarintCases_case = std::get<0>(GetParam());
  const int& kBlockSizes_case = std::get<1>(GetParam());
  ArrayOutputStream output(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedOutputStream coded_output(&output);

    coded_output.WriteVarint64(kVarintCases_case.value);
    EXPECT_FALSE(coded_output.HadError());

    EXPECT_EQ(kVarintCases_case.size, coded_output.ByteCount());
  }

  EXPECT_EQ(kVarintCases_case.size, output.ByteCount());
  EXPECT_EQ(0,
            memcmp(buffer_, kVarintCases_case.bytes, kVarintCases_case.size));
}